

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

cppnet * __thiscall cppnet::GetFormatTime_abi_cxx11_(cppnet *this,FormatTimeUnit unit)

{
  ulong uVar1;
  allocator local_61;
  string local_60 [36];
  uint32_t local_3c;
  char acStack_38 [4];
  uint32_t len;
  char buf [24];
  FormatTimeUnit unit_local;
  
  _acStack_38 = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  local_3c = 0x18;
  GetFormatTime(acStack_38,&local_3c,unit);
  uVar1 = (ulong)local_3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,acStack_38,uVar1,&local_61);
  std::__cxx11::string::string((string *)this,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return this;
}

Assistant:

std::string GetFormatTime(FormatTimeUnit unit) {
    char buf[__format_time_buf_size] = {0};
    uint32_t len = __format_time_buf_size;

    GetFormatTime(buf, len, unit);
    return std::move(std::string(buf, len));
}